

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void pageant_print_env(int pid)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *shell;
  int pid_local;
  
  if (shell_type == ADDRTYPE_UNSPEC) {
    __s = getenv("SHELL");
    if ((__s != (char *)0x0) && (sVar2 = strlen(__s), 2 < sVar2)) {
      sVar2 = strlen(__s);
      iVar1 = strcmp(__s + (sVar2 - 3),"csh");
      if (iVar1 == 0) {
        shell_type = ADDRTYPE_IPV6;
        goto LAB_00109b9f;
      }
    }
    shell_type = ADDRTYPE_IPV4;
  }
LAB_00109b9f:
  if (shell_type == ADDRTYPE_UNSPEC) {
    __assert_fail("false && \"SHELL_AUTO should have been eliminated by now\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                  ,0x125,"void pageant_print_env(int)");
  }
  if (shell_type == ADDRTYPE_IPV4) {
    printf("SSH_AUTH_SOCK=%s; export SSH_AUTH_SOCK;\nSSH_AGENT_PID=%d; export SSH_AGENT_PID;\n",
           socketname,(ulong)(uint)pid);
  }
  else if (shell_type == ADDRTYPE_IPV6) {
    printf("setenv SSH_AUTH_SOCK %s;\nsetenv SSH_AGENT_PID %d;\n",socketname,(ulong)(uint)pid);
  }
  return;
}

Assistant:

void pageant_print_env(int pid)
{
    if (shell_type == SHELL_AUTO) {
        /* Same policy as OpenSSH: if $SHELL ends in "csh" then assume
         * it's csh-shaped. */
        const char *shell = getenv("SHELL");
        if (shell && strlen(shell) >= 3 &&
            !strcmp(shell + strlen(shell) - 3, "csh"))
            shell_type = SHELL_CSH;
        else
            shell_type = SHELL_SH;
    }

    /*
     * These shell snippets could usefully pay some attention to
     * escaping of interesting characters. I don't think it causes a
     * problem at the moment, because the pathnames we use are so
     * utterly boring, but it's a lurking bug waiting to happen once
     * a bit more flexibility turns up.
     */

    switch (shell_type) {
      case SHELL_SH:
        printf("SSH_AUTH_SOCK=%s; export SSH_AUTH_SOCK;\n"
               "SSH_AGENT_PID=%d; export SSH_AGENT_PID;\n",
               socketname, pid);
        break;
      case SHELL_CSH:
        printf("setenv SSH_AUTH_SOCK %s;\n"
               "setenv SSH_AGENT_PID %d;\n",
               socketname, pid);
        break;
      case SHELL_AUTO:
        unreachable("SHELL_AUTO should have been eliminated by now");
        break;
    }
}